

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int datatype_elems(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *dt_local;
  Context_conflict *ctx_local;
  
  pMVar1 = reduce_datatype(ctx,dt);
  if (pMVar1->type == MOJOSHADER_AST_DATATYPE_VECTOR) {
    ctx_local._4_4_ = (pMVar1->array).elements;
  }
  else if (pMVar1->type == MOJOSHADER_AST_DATATYPE_MATRIX) {
    ctx_local._4_4_ = (pMVar1->array).elements * (pMVar1->matrix).columns;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int datatype_elems(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    dt = reduce_datatype(ctx, dt);
    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_VECTOR:
            return dt->vector.elements;
        case MOJOSHADER_AST_DATATYPE_MATRIX:
            return dt->matrix.rows * dt->matrix.columns;
        default:
            return 1;
    } // switch
}